

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

void despot::DESPOT::InitUpperBound
               (VNode *vnode,ScenarioUpperBound *upper_bound,RandomStreams *streams,History *history
               )

{
  int iVar1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  
  iVar1 = VNode::depth(vnode);
  RandomStreams::position(streams,iVar1);
  pvVar2 = VNode::particles(vnode);
  (*upper_bound->_vptr_ScenarioUpperBound[3])(upper_bound,pvVar2,streams,history);
  iVar1 = VNode::depth(vnode);
  dVar3 = pow(DAT_00192dc8,(double)iVar1);
  vnode->utility_upper_bound = dVar3 * extraout_XMM0_Qa;
  iVar1 = VNode::depth(vnode);
  dVar3 = pow(DAT_00192dc8,(double)iVar1);
  VNode::upper_bound(vnode,dVar3 * extraout_XMM0_Qa - DAT_00192dd0);
  return;
}

Assistant:

void DESPOT::InitUpperBound(VNode* vnode, ScenarioUpperBound* upper_bound,
	RandomStreams& streams, History& history) {
	streams.position(vnode->depth());
	double upper = upper_bound->Value(vnode->particles(), streams, history);
	vnode->utility_upper_bound = upper * Globals::Discount(vnode->depth());
	upper = upper * Globals::Discount(vnode->depth()) - Globals::config.pruning_constant;
	vnode->upper_bound(upper);
}